

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

QSocks5BindData * __thiscall
QSocks5BindStore::retrieve(QSocks5BindStore *this,qintptr socketDescriptor)

{
  long lVar1;
  bool bVar2;
  QSocks5BindData **ppQVar3;
  QMutexLocker<QRecursiveMutex> *pQVar4;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  const_iterator it_00;
  iterator iVar5;
  QSocks5BindData *bindData;
  const_iterator it;
  QMutexLocker<QRecursiveMutex> lock;
  QRecursiveMutex *in_stack_ffffffffffffff48;
  QMutexLocker<QRecursiveMutex> *in_stack_ffffffffffffff50;
  QHash<long_long,_QSocks5BindData_*> *in_stack_ffffffffffffff60;
  Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *this_00;
  QSocks5BindData *local_78;
  char local_70 [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QRecursiveMutex>::QMutexLocker(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  it_00 = QHash<long_long,_QSocks5BindData_*>::constFind
                    ((QHash<long_long,_QSocks5BindData_*> *)in_stack_ffffffffffffff50,
                     (longlong *)in_stack_ffffffffffffff48);
  QHash<long_long,_QSocks5BindData_*>::cend((QHash<long_long,_QSocks5BindData_*> *)in_RDI);
  bVar2 = QHash<long_long,_QSocks5BindData_*>::const_iterator::operator==
                    (in_RDI,(const_iterator *)in_stack_ffffffffffffff50);
  if (bVar2) {
    local_78 = (QSocks5BindData *)0x0;
  }
  else {
    ppQVar3 = QHash<long_long,_QSocks5BindData_*>::const_iterator::value((const_iterator *)0x36ec5c)
    ;
    local_78 = *ppQVar3;
    iVar5 = QHash<long_long,_QSocks5BindData_*>::erase(in_stack_ffffffffffffff60,it_00);
    this_00 = iVar5.i.d;
    if (local_78 != (QSocks5BindData *)0x0) {
      in_stack_ffffffffffffff50 = (QMutexLocker<QRecursiveMutex> *)QObject::thread();
      pQVar4 = (QMutexLocker<QRecursiveMutex> *)QThread::currentThread();
      if (in_stack_ffffffffffffff50 != pQVar4) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)this_00,(char *)in_RDI,
                   (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),(char *)in_stack_ffffffffffffff48
                  );
        QMessageLogger::warning(local_70,"Cannot access socks5 bind data from different thread");
        local_78 = (QSocks5BindData *)0x0;
        goto LAB_0036ed3d;
      }
    }
    bVar2 = QHash<long_long,_QSocks5BindData_*>::isEmpty
                      ((QHash<long_long,_QSocks5BindData_*> *)(in_RDI + 3));
    if (bVar2) {
      QBasicTimer::stop();
    }
  }
LAB_0036ed3d:
  QMutexLocker<QRecursiveMutex>::~QMutexLocker(in_stack_ffffffffffffff50);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_78;
}

Assistant:

QSocks5BindData *QSocks5BindStore::retrieve(qintptr socketDescriptor)
{
    QMutexLocker lock(&mutex);
    const auto it = store.constFind(socketDescriptor);
    if (it == store.cend())
        return nullptr;
    QSocks5BindData *bindData = it.value();
    store.erase(it);
    if (bindData) {
        if (bindData->controlSocket->thread() != QThread::currentThread()) {
            qWarning("Cannot access socks5 bind data from different thread");
            return nullptr;
        }
    } else {
        QSOCKS5_DEBUG << "__ERROR__ binddata == 0";
    }
    // stop the sweep timer if not needed
    if (store.isEmpty())
        sweepTimer.stop();
    return bindData;
}